

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::SetBlendFactors
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,float *BlendFactors,int param_2)

{
  Uint32 *pUVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  COMMAND_QUEUE_TYPE CVar5;
  bool bVar6;
  Uint32 f;
  long lVar7;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  char (*in_R9) [8];
  string msg;
  string local_58;
  String local_38;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  CVar5 = (this->m_Desc).QueueType;
  if (CVar5 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_58,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"SetBlendFactors",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x36c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&local_58,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SetBlendFactors",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x36c);
    Type = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      Type = extraout_DL_00;
    }
    CVar5 = (this->m_Desc).QueueType;
  }
  if ((~CVar5 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_38,(Diligent *)(ulong)CVar5,Type);
    FormatString<char[16],char[22],std::__cxx11::string,char[8]>
              (&local_58,(Diligent *)"SetBlendFactors",(char (*) [16])0x35c335,
               (char (*) [22])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SetBlendFactors",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x36c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  lVar7 = 0;
  bVar6 = false;
  do {
    bVar4 = bVar6;
    fVar2 = BlendFactors[lVar7];
    bVar3 = (float)this->m_BlendFactors[lVar7] != fVar2;
    bVar6 = (bool)(bVar4 | bVar3);
    this->m_BlendFactors[lVar7] = (Float32)fVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if ((bool)(bVar4 | bVar3)) {
    pUVar1 = &(this->m_Stats).CommandCounters.SetBlendFactors;
    *pUVar1 = *pUVar1 + 1;
  }
  return bVar6;
}

Assistant:

inline bool DeviceContextBase<ImplementationTraits>::SetBlendFactors(const float* BlendFactors, int)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetBlendFactors");

    bool FactorsDiffer = false;
    for (Uint32 f = 0; f < 4; ++f)
    {
        if (m_BlendFactors[f] != BlendFactors[f])
            FactorsDiffer = true;
        m_BlendFactors[f] = BlendFactors[f];
    }
    if (FactorsDiffer)
        ++m_Stats.CommandCounters.SetBlendFactors;

    return FactorsDiffer;
}